

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlattenPass.cpp
# Opt level: O2

PreservedAnalyses * __thiscall
Flatten::run(PreservedAnalyses *__return_storage_ptr__,Flatten *this,Module *M,
            ModuleAnalysisManager *AM)

{
  bool bVar1;
  bool bVar2;
  CallGraphNode *pCVar3;
  Module *F;
  Module *pMVar4;
  Flatten *this_00;
  SmallSetVector<llvm::Function_*,_4U> ModifiedFunctions;
  CallGraph CG;
  value_type local_f0;
  Module *local_e8;
  Module *local_e0;
  Flatten *local_d8;
  SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
  local_d0;
  Flatten local_78 [2];
  
  local_d8 = this;
  llvm::
  SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
  ::SetVector(&local_d0);
  local_e8 = M + 0x20;
  bVar2 = false;
  local_e0 = M;
  do {
    llvm::CallGraph::CallGraph((CallGraph *)local_78,local_e0);
    for (pMVar4 = local_e8; pMVar4 = *(Module **)pMVar4, pMVar4 != M + 0x18; pMVar4 = pMVar4 + 8) {
      F = pMVar4 + -0x38;
      if (pMVar4 == (Module *)0x0) {
        F = (Module *)0x0;
      }
      this_00 = local_78;
      pCVar3 = llvm::CallGraph::operator[]((CallGraph *)local_78,(Function *)F);
      pCVar3 = getSingleCaller(this_00,(CallGraph *)local_78,pCVar3);
      if (pCVar3 != (CallGraphNode *)0x0) {
        bVar1 = inlineFunction(local_d8,(Function *)F,*(Function **)(pCVar3 + 8));
        if (bVar1) {
          local_f0 = *(value_type *)(pCVar3 + 8);
          llvm::
          SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
          ::insert(&local_d0,&local_f0);
          local_f0 = (value_type)F;
          llvm::
          SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
          ::remove(&local_d0,(char *)&local_f0);
          bVar2 = true;
          break;
        }
      }
    }
    llvm::CallGraph::~CallGraph((CallGraph *)local_78);
    if (pMVar4 == M + 0x18) {
      if (bVar2) {
        llvm::PreservedAnalyses::none();
      }
      else {
        llvm::PreservedAnalyses::all();
      }
      llvm::
      SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
      ::~SetVector(&local_d0);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

llvm::PreservedAnalyses Flatten::run(Module &M, ModuleAnalysisManager &AM) {
  bool ModifiedAny = false;
  bool ModifiedOne = false;
  SmallSetVector<Function *, 4> ModifiedFunctions;

  // We keep running, inlining functions into other functions, until there's
  // no work left to do.
  do {
    ModifiedOne = false;

    // Build the call graph of the entire module.
    CallGraph CG(M);

    for (Function &F : M.functions()) {
      CallGraphNode *CGN = CG[&F];
      CallGraphNode *Caller = getSingleCaller(CG, CGN);

      if (Caller == nullptr) {
        continue; // We need a function with a single caller function
      }

      if (inlineFunction(&F, Caller->getFunction())) {
        // Keep track of functions that need reg2mem
        ModifiedFunctions.insert(Caller->getFunction());
        ModifiedFunctions.remove(&F);

        // Mark the module as modified and start over
        ModifiedOne = true;
        ModifiedAny = true;
        break;
      }
    }

  } while (ModifiedOne);

  if (ModifiedAny) {
    return llvm::PreservedAnalyses::none();
  }
  return llvm::PreservedAnalyses::all();
}